

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O2

void __thiscall spvtools::opt::IRContext::BuildInvalidAnalyses(IRContext *this,Analysis set)

{
  Analysis AVar1;
  
  AVar1 = ~this->valid_analyses_ & set;
  if ((AVar1 & kAnalysisBegin) != kAnalysisNone) {
    BuildDefUseManager(this);
  }
  if ((AVar1 & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
    BuildInstrToBlockMapping(this);
  }
  if ((AVar1 & kAnalysisDecorations) != kAnalysisNone) {
    BuildDecorationManager(this);
  }
  if ((AVar1 & kAnalysisCFG) != kAnalysisNone) {
    BuildCFG(this);
  }
  if ((AVar1 & kAnalysisDominatorAnalysis) != kAnalysisNone) {
    ResetDominatorAnalysis(this);
  }
  if ((AVar1 & kAnalysisLoopAnalysis) != kAnalysisNone) {
    ResetLoopAnalysis(this);
  }
  if ((AVar1 >> 0xc & 1) != 0) {
    ResetBuiltinAnalysis(this);
  }
  if ((char)AVar1 < '\0') {
    BuildIdToNameMap(this);
  }
  if ((AVar1 >> 8 & 1) != 0) {
    BuildScalarEvolutionAnalysis(this);
  }
  if ((AVar1 >> 9 & 1) != 0) {
    BuildRegPressureAnalysis(this);
  }
  if ((AVar1 >> 10 & 1) != 0) {
    BuildValueNumberTable(this);
  }
  if ((AVar1 >> 0xb & 1) != 0) {
    BuildStructuredCFGAnalysis(this);
  }
  if ((AVar1 >> 0xd & 1) != 0) {
    BuildIdToFuncMapping(this);
  }
  if ((AVar1 >> 0xe & 1) != 0) {
    BuildConstantManager(this);
  }
  if ((short)AVar1 < 0) {
    BuildTypeManager(this);
  }
  if ((AVar1 >> 0x10 & 1) != 0) {
    BuildDebugInfoManager(this);
  }
  if ((AVar1 >> 0x11 & 1) == 0) {
    return;
  }
  BuildLivenessManager(this);
  return;
}

Assistant:

void IRContext::BuildInvalidAnalyses(IRContext::Analysis set) {
  set = Analysis(set & ~valid_analyses_);

  if (set & kAnalysisDefUse) {
    BuildDefUseManager();
  }
  if (set & kAnalysisInstrToBlockMapping) {
    BuildInstrToBlockMapping();
  }
  if (set & kAnalysisDecorations) {
    BuildDecorationManager();
  }
  if (set & kAnalysisCFG) {
    BuildCFG();
  }
  if (set & kAnalysisDominatorAnalysis) {
    ResetDominatorAnalysis();
  }
  if (set & kAnalysisLoopAnalysis) {
    ResetLoopAnalysis();
  }
  if (set & kAnalysisBuiltinVarId) {
    ResetBuiltinAnalysis();
  }
  if (set & kAnalysisNameMap) {
    BuildIdToNameMap();
  }
  if (set & kAnalysisScalarEvolution) {
    BuildScalarEvolutionAnalysis();
  }
  if (set & kAnalysisRegisterPressure) {
    BuildRegPressureAnalysis();
  }
  if (set & kAnalysisValueNumberTable) {
    BuildValueNumberTable();
  }
  if (set & kAnalysisStructuredCFG) {
    BuildStructuredCFGAnalysis();
  }
  if (set & kAnalysisIdToFuncMapping) {
    BuildIdToFuncMapping();
  }
  if (set & kAnalysisConstants) {
    BuildConstantManager();
  }
  if (set & kAnalysisTypes) {
    BuildTypeManager();
  }
  if (set & kAnalysisDebugInfo) {
    BuildDebugInfoManager();
  }
  if (set & kAnalysisLiveness) {
    BuildLivenessManager();
  }
}